

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

int add_pending_write_callback(CMConnection conn,CMWriteCallbackFunc handler,void *client_data)

{
  void *pvVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  int count;
  size_t in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  uint uVar2;
  int iVar3;
  
  iVar3 = 0;
  while( true ) {
    uVar2 = in_stack_ffffffffffffffe0 & 0xffffff;
    if ((*(long *)(in_RDI + 0x58) != 0) &&
       (uVar2 = in_stack_ffffffffffffffe0 & 0xffffff, (ulong)(long)iVar3 < *(ulong *)(in_RDI + 0x50)
       )) {
      uVar2 = CONCAT13(*(long *)(*(long *)(in_RDI + 0x58) + (long)iVar3 * 0x10) != 0,
                       (int3)in_stack_ffffffffffffffe0);
    }
    if ((char)(uVar2 >> 0x18) == '\0') break;
    iVar3 = iVar3 + 1;
    in_stack_ffffffffffffffe0 = uVar2;
  }
  if (*(ulong *)(in_RDI + 0x50) < (ulong)(long)(iVar3 + 1)) {
    if (*(long *)(in_RDI + 0x58) == 0) {
      pvVar1 = INT_CMmalloc(CONCAT44(iVar3,uVar2));
      *(void **)(in_RDI + 0x58) = pvVar1;
      *(undefined8 *)(in_RDI + 0x50) = 1;
    }
    else {
      pvVar1 = INT_CMrealloc((void *)CONCAT44(iVar3,uVar2),in_stack_ffffffffffffffd8);
      *(void **)(in_RDI + 0x58) = pvVar1;
      *(long *)(in_RDI + 0x50) = (long)(iVar3 + 1);
    }
  }
  *(undefined8 *)(*(long *)(in_RDI + 0x58) + (long)iVar3 * 0x10) = in_RSI;
  *(undefined8 *)(*(long *)(in_RDI + 0x58) + (long)iVar3 * 0x10 + 8) = in_RDX;
  return iVar3;
}

Assistant:

static int
 add_pending_write_callback(CMConnection conn, CMWriteCallbackFunc handler, 
			    void* client_data)
 {
     int count = 0;
     while (conn->write_callbacks && count < conn->write_callback_len &&
	    (conn->write_callbacks[count].func != NULL)) count++;
     if (count + 1 > conn->write_callback_len) {
	 if (conn->write_callbacks == NULL) {
	     conn->write_callbacks = malloc(sizeof(conn->write_callbacks[0]));
	     conn->write_callback_len = 1;
	 } else {
	     conn->write_callbacks = 
		 realloc(conn->write_callbacks,
			 sizeof(conn->write_callbacks[0])*(count+1));
	     conn->write_callback_len = count+1;
	 }
     }
     conn->write_callbacks[count].func = handler;
     conn->write_callbacks[count].client_data = client_data;
     return count;
 }